

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O0

void bench_ellswift_create(void *arg,int iters)

{
  int iVar1;
  int in_ESI;
  undefined8 *in_RDI;
  uchar buf [64];
  bench_ellswift_data *data;
  int i;
  undefined1 auStack_58 [64];
  undefined8 *local_18;
  int local_10;
  int local_c;
  
  local_10 = 0;
  local_18 = in_RDI;
  local_c = in_ESI;
  while( true ) {
    if (local_c <= local_10) {
      return;
    }
    iVar1 = secp256k1_ellswift_create(*local_18,auStack_58,local_18 + 0x801,local_18 + 0x805);
    if (iVar1 == 0) break;
    memcpy(local_18 + 0x801,auStack_58,0x40);
    local_10 = local_10 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/ellswift/bench_impl.h"
          ,0x38,
          "test condition failed: secp256k1_ellswift_create(data->ctx, buf, data->rnd64, data->rnd64 + 32)"
         );
  abort();
}

Assistant:

static void bench_ellswift_create(void *arg, int iters) {
    int i;
    bench_ellswift_data *data = (bench_ellswift_data*)arg;

    for (i = 0; i < iters; i++) {
        unsigned char buf[64];
        CHECK(secp256k1_ellswift_create(data->ctx, buf, data->rnd64, data->rnd64 + 32));
        memcpy(data->rnd64, buf, 64);
    }
}